

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<char,_std::char_traits<char>_> *stream,uint options,xml_encoding encoding)

{
  xml_document_struct *doc;
  undefined *puVar1;
  xml_encoding encoding_00;
  long lVar2;
  long lVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  void *contents;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 *puVar9;
  xml_parse_status xVar10;
  xml_document *pxVar11;
  void *pvVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  size_t local_58;
  
  _destroy(this);
  _create(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00197618;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar2 = std::istream::tellg();
  if (lVar2 < 0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    local_58 = 0;
    puVar6 = (undefined8 *)0x0;
    puVar9 = (undefined8 *)0x0;
    pxVar11 = this;
LAB_00197443:
    puVar7 = puVar9;
    if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) goto LAB_0019745d;
    contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                 xml_memory_management_function_storage<int>::allocate)
                                 (local_58 + 1);
    if (contents != (void *)0x0) {
      pvVar4 = contents;
      if (puVar9 != (undefined8 *)0x0) {
        puVar6 = puVar9;
        do {
          if ((long)contents + local_58 < (ulong)((long)pvVar4 + puVar6[1])) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                          ,0x1372,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                         );
          }
          memcpy(pvVar4,puVar6 + 2,puVar6[1]);
          pvVar4 = (void *)((long)pvVar4 + puVar6[1]);
          puVar6 = (undefined8 *)*puVar6;
        } while (puVar6 != (undefined8 *)0x0);
      }
      pxVar11 = (xml_document *)0x0;
      if (pvVar4 != (void *)((long)contents + local_58)) {
        __assert_fail("write == buffer + total",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                      ,0x1377,
                      "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                     );
      }
      goto LAB_001975c7;
    }
    pxVar11 = (xml_document *)0x3;
    goto LAB_001975bc;
  }
  auVar14 = std::istream::tellg();
  lVar2 = auVar14._0_8_;
  local_58 = 0;
  xVar10 = status_io_error;
  std::istream::seekg((long)stream,_S_beg);
  lVar3 = std::istream::tellg();
  std::istream::seekg(stream,lVar2,auVar14._8_8_);
  contents = (void *)0x0;
  if (-1 < lVar2 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar8 = lVar3 - lVar2;
    if ((long)uVar8 < 0) {
      xVar10 = status_out_of_memory;
      local_58 = 0;
      contents = (void *)0x0;
    }
    else {
      pvVar4 = (void *)(*(code *)impl::(anonymous_namespace)::
                                 xml_memory_management_function_storage<int>::allocate)(uVar8 + 1);
      puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
      if (pvVar4 == (void *)0x0) {
        xVar10 = status_out_of_memory;
LAB_001975a9:
        local_58 = 0;
        contents = (void *)0x0;
        pvVar12 = pvVar4;
      }
      else {
        std::istream::read((char *)stream,(long)pvVar4);
        xVar10 = status_ok;
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          xVar10 = status_io_error;
          goto LAB_001975a9;
        }
        local_58 = *(size_t *)(stream + 8);
        if (uVar8 < local_58) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0x139c,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                       );
        }
        pvVar12 = (void *)0x0;
        contents = pvVar4;
      }
      if (pvVar12 != (void *)0x0) {
        (*(code *)puVar1)(pvVar12);
      }
    }
  }
LAB_00197608:
  if (xVar10 == status_ok) {
    encoding_00 = impl::anon_unknown_0::get_buffer_encoding(encoding,contents,local_58);
    if (encoding_00 == encoding_utf8) {
      *(undefined1 *)((long)contents + local_58) = 0;
      local_58 = local_58 + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,local_58,options,
               encoding_00,true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = xVar10;
LAB_00197618:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
LAB_0019745d:
  puVar5 = (undefined8 *)
           (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                     allocate)(0x7fe8);
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = (undefined8 *)0x0;
  }
  else {
    *puVar5 = 0;
    puVar5[1] = 0;
  }
  if (puVar5 == (undefined8 *)0x0) {
    pxVar11 = (xml_document *)0x3;
    bVar13 = false;
    puVar5 = puVar6;
  }
  else {
    puVar7 = puVar5;
    if (puVar6 != (undefined8 *)0x0) {
      *puVar6 = puVar5;
      puVar7 = puVar9;
    }
    std::istream::read((char *)stream,(long)(puVar5 + 2));
    lVar2 = *(long *)(stream + 8);
    puVar5[1] = lVar2;
    if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
        (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
      pxVar11 = (xml_document *)0x2;
      bVar13 = false;
    }
    else {
      uVar8 = lVar2 + local_58;
      bVar13 = local_58 <= uVar8;
      if (local_58 < uVar8) {
        local_58 = uVar8;
      }
      pxVar11 = (xml_document *)((ulong)pxVar11 & 0xffffffff);
      if (!bVar13) {
        pxVar11 = (xml_document *)0x3;
      }
    }
  }
  puVar6 = puVar5;
  puVar9 = puVar7;
  if (!bVar13) goto LAB_001975bc;
  goto LAB_00197443;
LAB_001975bc:
  local_58 = 0;
  contents = (void *)0x0;
  puVar9 = puVar7;
LAB_001975c7:
  while (xVar10 = (xml_parse_status)pxVar11, puVar9 != (undefined8 *)0x0) {
    puVar6 = (undefined8 *)*puVar9;
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (puVar9);
    puVar9 = puVar6;
  }
  goto LAB_00197608;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<char>& stream, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding, &_buffer);
	}